

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O3

bool __thiscall
SQClass::NewSlot(SQClass *this,SQSharedState *ss,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  uint uVar3;
  SQTable *pSVar4;
  SQTable *pSVar5;
  SQClass *pSVar6;
  long *plVar7;
  SQDelegable *pSVar8;
  bool bVar9;
  SQObjectType SVar10;
  SQObjectType SVar11;
  SQInteger SVar12;
  ulong uVar13;
  SQObjectValue SVar14;
  SQClassMember *pSVar15;
  ulong uVar16;
  char cVar17;
  SQObjectPtr *this_00;
  SQUnsignedInteger SVar18;
  bool isconstructor;
  SQObjectPtr theval;
  SQObjectPtr temp;
  bool local_79;
  SQObjectPtr local_78;
  SQObjectPtr local_68;
  SQObjectPtr local_58;
  SQObjectPtr local_48;
  SQObjectPtr local_38;
  
  local_48.super_SQObject._type = OT_NULL;
  local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar10 = (val->super_SQObject)._type;
  cVar17 = '\x01';
  if (((SVar10 == OT_CLOSURE) || (SVar10 == OT_NATIVECLOSURE)) ||
     (cVar17 = bstatic, (byte)(this->_locked ^ 1U | bstatic) == 1)) {
    bVar9 = SQTable::Get(this->_members,key,&local_48);
    if ((bVar9) && ((local_48.super_SQObject._unVal._0_4_ >> 0x19 & 1) != 0)) {
      pSVar15 = (this->_defaultvalues)._vals;
      uVar13 = (ulong)((local_48.super_SQObject._unVal._0_4_ & 0xffffff) << 5);
      uVar3 = *(uint *)((long)&(pSVar15->val).super_SQObject._type + uVar13);
      plVar7 = *(long **)((long)&(pSVar15->val).super_SQObject._unVal + uVar13);
      pSVar4 = (val->super_SQObject)._unVal.pTable;
      *(SQTable **)((long)&(pSVar15->val).super_SQObject._unVal + uVar13) = pSVar4;
      SVar10 = (val->super_SQObject)._type;
      *(SQObjectType *)((long)&(pSVar15->val).super_SQObject._type + uVar13) = SVar10;
      if ((SVar10 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      bVar9 = true;
      if ((uVar3 >> 0x1b & 1) != 0) {
        plVar2 = plVar7 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar7 + 0x10))();
        }
      }
    }
    else {
      if (cVar17 == '\0') {
        local_58.super_SQObject._type = OT_NULL;
        local_58.super_SQObject._unVal.pTable = (SQTable *)0x0;
        local_68.super_SQObject._unVal = (SQObjectValue)(val->super_SQObject)._unVal.pTable;
        local_68.super_SQObject._type = (val->super_SQObject)._type;
        if ((local_68.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        local_78.super_SQObject._unVal.nInteger = (this->_defaultvalues)._size | 0x2000000;
        local_78.super_SQObject._type = OT_INTEGER;
        SQTable::NewSlot(this->_members,key,&local_78);
        SQObjectPtr::~SQObjectPtr(&local_78);
        uVar13 = (this->_defaultvalues)._allocated;
        pSVar15 = (this->_defaultvalues)._vals;
        uVar16 = (this->_defaultvalues)._size;
        if (uVar13 <= uVar16) {
          SVar18 = 4;
          if (uVar16 * 2 != 0) {
            SVar18 = uVar16 * 2;
          }
          pSVar15 = (SQClassMember *)sq_vm_realloc(pSVar15,uVar13 << 5,SVar18 << 5);
          (this->_defaultvalues)._vals = pSVar15;
          (this->_defaultvalues)._allocated = SVar18;
          uVar16 = (this->_defaultvalues)._size;
        }
        (this->_defaultvalues)._size = uVar16 + 1;
        pSVar15[uVar16].val.super_SQObject._type = local_68.super_SQObject._type;
        pSVar15[uVar16].val.super_SQObject._unVal.pTable = (SQTable *)local_68.super_SQObject._unVal
        ;
        if ((local_68.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        pSVar15[uVar16].attrs.super_SQObject._type = local_58.super_SQObject._type;
        pSVar15[uVar16].attrs.super_SQObject._unVal.pTable =
             (SQTable *)local_58.super_SQObject._unVal;
        if ((local_58.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_58.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        SQObjectPtr::~SQObjectPtr(&local_58);
        this_00 = &local_68;
      }
      else {
        SVar10 = (val->super_SQObject)._type;
        if ((SVar10 == OT_NATIVECLOSURE) || (SVar10 == OT_CLOSURE)) {
          SVar12 = SQSharedState::GetMetaMethodIdxByName(ss,key);
          if (SVar12 != -1) {
            SVar10 = this->_metamethods[SVar12].super_SQObject._type;
            pSVar4 = this->_metamethods[SVar12].super_SQObject._unVal.pTable;
            pSVar5 = (val->super_SQObject)._unVal.pTable;
            this->_metamethods[SVar12].super_SQObject._unVal.pTable = pSVar5;
            SVar11 = (val->super_SQObject)._type;
            this->_metamethods[SVar12].super_SQObject._type = SVar11;
            if ((SVar11 >> 0x1b & 1) != 0) {
              pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 + 1;
            }
            bVar9 = true;
            if ((SVar10 >> 0x1b & 1) != 0) {
              pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 - 1;
              if (*pSVar1 == 0) {
                (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _vptr_SQRefCounted[2])();
              }
            }
            goto LAB_00118ea6;
          }
          SVar10 = (val->super_SQObject)._type;
        }
        local_78.super_SQObject._unVal = (SQObjectValue)(val->super_SQObject)._unVal.pTable;
        SVar11 = SVar10;
        if ((SVar10 >> 0x1b & 1) != 0) {
          pSVar1 = &((local_78.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
          SVar11 = (val->super_SQObject)._type;
        }
        local_78.super_SQObject._type = SVar10;
        if ((this->_base != (SQClass *)0x0) && (SVar11 == OT_CLOSURE)) {
          SVar14.pClosure = SQClosure::Clone((val->super_SQObject)._unVal.pClosure);
          SVar10 = local_78.super_SQObject._type;
          local_78.super_SQObject._type = OT_CLOSURE;
          pSVar1 = &((SVar14.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _uiRef;
          *pSVar1 = *pSVar1 + 1;
          if ((SVar10 >> 0x1b & 1) != 0) {
            pSVar1 = &((local_78.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 - 1;
            if (*pSVar1 == 0) {
              pSVar8 = &(local_78.super_SQObject._unVal.pTable)->super_SQDelegable;
              local_78.super_SQObject._unVal.pClosure = SVar14.pClosure;
              (*(pSVar8->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
              SVar14 = local_78.super_SQObject._unVal;
            }
          }
          local_78.super_SQObject._unVal = SVar14;
          pSVar6 = this->_base;
          (local_78.super_SQObject._unVal.pClosure)->_base = pSVar6;
          pSVar1 = &(pSVar6->super_SQCollectable).super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if (local_48.super_SQObject._type == OT_NULL) {
          SQVM::IsEqual(&ss->_constructoridx,key,&local_79);
          if (local_79 == true) {
            this->_constructoridx = (this->_methods)._size;
          }
          local_58.super_SQObject._type = OT_NULL;
          local_58.super_SQObject._unVal.pTable = (SQTable *)0x0;
          local_68.super_SQObject._unVal.pTable = local_78.super_SQObject._unVal.pTable;
          local_68.super_SQObject._type = local_78.super_SQObject._type;
          if ((local_78.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar1 = &((local_78.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          local_38.super_SQObject._unVal.nInteger = (this->_methods)._size | 0x1000000;
          local_38.super_SQObject._type = OT_INTEGER;
          SQTable::NewSlot(this->_members,key,&local_38);
          SQObjectPtr::~SQObjectPtr(&local_38);
          uVar13 = (this->_methods)._allocated;
          pSVar15 = (this->_methods)._vals;
          uVar16 = (this->_methods)._size;
          if (uVar13 <= uVar16) {
            SVar18 = 4;
            if (uVar16 * 2 != 0) {
              SVar18 = uVar16 * 2;
            }
            pSVar15 = (SQClassMember *)sq_vm_realloc(pSVar15,uVar13 << 5,SVar18 << 5);
            (this->_methods)._vals = pSVar15;
            (this->_methods)._allocated = SVar18;
            uVar16 = (this->_methods)._size;
          }
          (this->_methods)._size = uVar16 + 1;
          pSVar15[uVar16].val.super_SQObject._type = local_68.super_SQObject._type;
          pSVar15[uVar16].val.super_SQObject._unVal.pTable =
               (SQTable *)local_68.super_SQObject._unVal;
          if ((local_68.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          pSVar15[uVar16].attrs.super_SQObject._type = local_58.super_SQObject._type;
          pSVar15[uVar16].attrs.super_SQObject._unVal.pTable =
               (SQTable *)local_58.super_SQObject._unVal;
          if ((local_58.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar1 = &((local_58.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          SQObjectPtr::~SQObjectPtr(&local_58);
          SQObjectPtr::~SQObjectPtr(&local_68);
        }
        else {
          pSVar15 = (this->_methods)._vals;
          uVar13 = (ulong)(((uint)local_48.super_SQObject._unVal.fFloat & 0xffffff) << 5);
          uVar3 = *(uint *)((long)&(pSVar15->val).super_SQObject._type + uVar13);
          plVar7 = *(long **)((long)&(pSVar15->val).super_SQObject._unVal + uVar13);
          ((SQObjectValue *)((long)&(pSVar15->val).super_SQObject._unVal + uVar13))->pTable =
               (SQTable *)local_78.super_SQObject._unVal;
          *(SQObjectType *)((long)&(pSVar15->val).super_SQObject._type + uVar13) =
               local_78.super_SQObject._type;
          if ((local_78.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar1 = &((local_78.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          if ((uVar3 >> 0x1b & 1) != 0) {
            plVar2 = plVar7 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar7 + 0x10))();
            }
          }
        }
        this_00 = &local_78;
      }
      SQObjectPtr::~SQObjectPtr(this_00);
      bVar9 = true;
    }
  }
  else {
    bVar9 = false;
  }
LAB_00118ea6:
  SQObjectPtr::~SQObjectPtr(&local_48);
  return bVar9;
}

Assistant:

bool SQClass::NewSlot(SQSharedState *ss,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    SQObjectPtr temp;
    bool belongs_to_static_table = type(val) == OT_CLOSURE || type(val) == OT_NATIVECLOSURE || bstatic;
    if(_locked && !belongs_to_static_table)
        return false; //the class already has an instance so cannot be modified
    if(_members->Get(key,temp) && _isfield(temp)) //overrides the default value
    {
        _defaultvalues[_member_idx(temp)].val = val;
        return true;
    }
    if(belongs_to_static_table) {
        SQInteger mmidx;
        if((type(val) == OT_CLOSURE || type(val) == OT_NATIVECLOSURE) &&
            (mmidx = ss->GetMetaMethodIdxByName(key)) != -1) {
            _metamethods[mmidx] = val;
        }
        else {
            SQObjectPtr theval = val;
            if(_base && type(val) == OT_CLOSURE) {
                theval = _closure(val)->Clone();
                _closure(theval)->_base = _base;
                __ObjAddRef(_base); //ref for the closure
            }
            if(type(temp) == OT_NULL) {
                bool isconstructor;
                SQVM::IsEqual(ss->_constructoridx, key, isconstructor);
                if(isconstructor) {
                    _constructoridx = (SQInteger)_methods.size();
                }
                SQClassMember m;
                m.val = theval;
                _members->NewSlot(key,SQObjectPtr(_make_method_idx(_methods.size())));
                _methods.push_back(m);
            }
            else {
                _methods[_member_idx(temp)].val = theval;
            }
        }
        return true;
    }
    SQClassMember m;
    m.val = val;
    _members->NewSlot(key,SQObjectPtr(_make_field_idx(_defaultvalues.size())));
    _defaultvalues.push_back(m);
    return true;
}